

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O1

LY_ERR lys_precompile_own_deviation(lysc_ctx *ctx,lysp_deviation *dev_p,lysp_module *pmod)

{
  void **ppvVar1;
  ly_ht **pplVar2;
  lyd_node *plVar3;
  lysc_node *plVar4;
  void *pvVar5;
  lyd_node_inner *plVar6;
  ly_ht *plVar7;
  bool bVar8;
  lysc_nodeid *nodeid1;
  ly_bool lVar9;
  LY_ERR LVar10;
  lys_module *plVar11;
  undefined8 *puVar12;
  lyd_node *object;
  ulong uVar13;
  lysc_nodeid *nodeid;
  lysc_nodeid *local_38;
  
  local_38 = (lysc_nodeid *)0x0;
  LVar10 = lys_precompile_nodeid(ctx->ctx,dev_p->nodeid,&local_38);
  nodeid1 = local_38;
  if (LVar10 != LY_SUCCESS) goto LAB_0015366b;
  plVar11 = lys_schema_node_get_module(ctx->ctx,*local_38->prefix,pmod);
  if (plVar11 == (lys_module *)0x0) {
    LVar10 = LY_EINT;
    ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
           ,0x8eb);
    goto LAB_0015366b;
  }
  LVar10 = LY_SUCCESS;
  if (plVar11 != ctx->cur_mod) goto LAB_0015366b;
  if ((ctx->devs).count == 0) {
    object = (lyd_node *)0x0;
  }
  else {
    object = (lyd_node *)0x0;
    uVar13 = 0;
    do {
      plVar3 = (ctx->devs).field_2.dnodes[uVar13];
      lVar9 = lys_abs_schema_nodeid_match
                        (ctx->ctx,nodeid1,pmod,*(lysc_nodeid **)plVar3,
                         *(lysp_module **)&plVar3->parent->field_0);
      if (lVar9 != '\0') {
        object = (ctx->devs).field_2.dnodes[uVar13];
        break;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ctx->devs).count);
  }
  if (object == (lyd_node *)0x0) {
    object = (lyd_node *)calloc(1,0x20);
    if (object == (lyd_node *)0x0) {
      LVar10 = LY_EMEM;
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_precompile_own_deviation");
      goto LAB_0015366b;
    }
    LVar10 = ly_set_add(&ctx->devs,object,'\x01',(uint32_t *)0x0);
    if (LVar10 != LY_SUCCESS) goto LAB_0015366b;
    *(lysc_nodeid **)object = nodeid1;
    local_38 = (lysc_nodeid *)0x0;
  }
  plVar4 = object->schema;
  if (plVar4 == (lysc_node *)0x0) {
    puVar12 = (undefined8 *)malloc(0x10);
    if (puVar12 == (undefined8 *)0x0) goto LAB_001537c5;
    *puVar12 = 1;
LAB_001537b6:
    object->schema = (lysc_node *)(puVar12 + 1);
    bVar8 = true;
    LVar10 = LY_SUCCESS;
  }
  else {
    pvVar5 = plVar4[-1].priv;
    plVar4[-1].priv = (void *)((long)pvVar5 + 1);
    puVar12 = (undefined8 *)realloc(&plVar4[-1].priv,(long)pvVar5 * 8 + 0x10);
    if (puVar12 != (undefined8 *)0x0) goto LAB_001537b6;
    ppvVar1 = &object->schema[-1].priv;
    *ppvVar1 = (void *)((long)*ppvVar1 + -1);
LAB_001537c5:
    bVar8 = false;
    LVar10 = LY_EMEM;
    ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
           "lys_precompile_own_deviation");
  }
  if (!bVar8) goto LAB_0015366b;
  *(lysp_deviation **)(object->schema->hash + (long)object->schema[-1].priv * 8 + -0xc) = dev_p;
  plVar6 = object->parent;
  if (plVar6 == (lyd_node_inner *)0x0) {
    puVar12 = (undefined8 *)malloc(0x10);
    if (puVar12 == (undefined8 *)0x0) goto LAB_00153883;
    *puVar12 = 1;
LAB_00153876:
    object->parent = (lyd_node_inner *)(puVar12 + 1);
    bVar8 = true;
  }
  else {
    plVar7 = plVar6[-1].children_ht;
    plVar6[-1].children_ht = (ly_ht *)((long)&plVar7->used + 1);
    puVar12 = (undefined8 *)realloc(&plVar6[-1].children_ht,(long)plVar7 * 8 + 0x10);
    if (puVar12 != (undefined8 *)0x0) goto LAB_00153876;
    pplVar2 = &object->parent[-1].children_ht;
    *pplVar2 = (ly_ht *)((long)&(*pplVar2)[-1].recs + 7);
LAB_00153883:
    bVar8 = false;
    LVar10 = LY_EMEM;
    ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
           "lys_precompile_own_deviation");
  }
  if (bVar8) {
    *(lysp_module **)((long)object->parent + (long)object->parent[-1].children_ht * 8 + -8) = pmod;
  }
LAB_0015366b:
  lysc_nodeid_free(ctx->ctx,local_38);
  return LVar10;
}

Assistant:

static LY_ERR
lys_precompile_own_deviation(struct lysc_ctx *ctx, struct lysp_deviation *dev_p, const struct lysp_module *pmod)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_deviation *dev = NULL;
    struct lysc_nodeid *nodeid = NULL;
    struct lysp_deviation **new_dev;
    const struct lys_module *mod;
    const struct lysp_module **new_dev_pmod;
    uint32_t i;

    /* parse its target, it was already parsed and fully checked (except for the existence of the nodes) */
    ret = lys_precompile_nodeid(ctx->ctx, dev_p->nodeid, &nodeid);
    LY_CHECK_GOTO(ret, cleanup);

    mod = lys_schema_node_get_module(ctx->ctx, nodeid->prefix[0], pmod);
    LY_CHECK_ERR_GOTO(!mod, LOGINT(ctx->ctx); ret = LY_EINT, cleanup);
    if (mod != ctx->cur_mod) {
        /* deviation for another module, ignore */
        goto cleanup;
    }

    /* try to find the node in already compiled deviations */
    for (i = 0; i < ctx->devs.count; ++i) {
        if (lys_abs_schema_nodeid_match(ctx->ctx, nodeid, pmod, ((struct lysc_deviation *)ctx->devs.objs[i])->nodeid,
                ((struct lysc_deviation *)ctx->devs.objs[i])->dev_pmods[0])) {
            dev = ctx->devs.objs[i];
            break;
        }
    }

    if (!dev) {
        /* allocate new compiled deviation */
        dev = calloc(1, sizeof *dev);
        LY_CHECK_ERR_GOTO(!dev, LOGMEM(ctx->ctx); ret = LY_EMEM, cleanup);
        LY_CHECK_GOTO(ret = ly_set_add(&ctx->devs, dev, 1, NULL), cleanup);

        dev->nodeid = nodeid;
        nodeid = NULL;
    }

    /* add new parsed deviation structure */
    LY_ARRAY_NEW_GOTO(ctx->ctx, dev->devs, new_dev, ret, cleanup);
    *new_dev = dev_p;
    LY_ARRAY_NEW_GOTO(ctx->ctx, dev->dev_pmods, new_dev_pmod, ret, cleanup);
    *new_dev_pmod = pmod;

cleanup:
    lysc_nodeid_free(ctx->ctx, nodeid);
    return ret;
}